

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void covscript_main(int args_size,char **args)

{
  compiler_type *this;
  element_type *peVar1;
  ctrl_t *pcVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  fatal_error *this_00;
  char **ppcVar7;
  char *pcVar8;
  long lVar9;
  initializer_list<cs_impl::any> __l;
  context_t context;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  iterator __begin4;
  int code;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_440;
  undefined1 local_438 [16];
  string path;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_3c8;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_3a8;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  ofstream out;
  anon_union_8_1_a8a14541_for_iterator_1 local_310;
  array arg;
  method_base **local_c8;
  method_base **local_c0;
  
  iVar5 = covscript_args(args_size,args);
  cs::get_import_path_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,':',
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg);
  std::__cxx11::string::append((string *)(cs::current_process + 0x58));
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&arg);
  if (show_help_info == true) {
    std::operator<<((ostream *)&std::cout,"Usage:\n");
    std::operator<<((ostream *)&std::cout,"    cs [options...] <FILE|STDIN> [arguments...]\n");
    std::operator<<((ostream *)&std::cout,"    cs [options...]\n");
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar6 = std::operator<<((ostream *)&std::cout,"Interpreter Options:");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::operator<<((ostream *)&std::cout,"    Option                Mnemonic   Function\n");
    std::operator<<((ostream *)&std::cout,"  --compile-only         -c          Only compile\n");
    std::operator<<((ostream *)&std::cout,
                    "  --dump-ast             -d          Export abstract syntax tree\n");
    std::operator<<((ostream *)&std::cout,
                    "  --dependency           -r          Export module dependency\n");
    std::operator<<((ostream *)&std::cout,
                    "  --csym         <FILE>  -g <FILE>   Read cSYM from file\n");
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar6 = std::operator<<((ostream *)&std::cout,"Interpreter REPL Options:");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::operator<<((ostream *)&std::cout,"    Option                Mnemonic   Function\n");
    std::operator<<((ostream *)&std::cout,
                    "  --silent               -s          Close the command prompt\n");
    std::operator<<((ostream *)&std::cout,"  --args <...>           -a <...>    Set the arguments\n"
                   );
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar6 = std::operator<<((ostream *)&std::cout,"Common Options:");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::operator<<((ostream *)&std::cout,"    Option                Mnemonic   Function\n");
    std::operator<<((ostream *)&std::cout,"  --no-optimize          -o          Disable optimizer\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "  --help                 -h          Show help infomation\n");
    std::operator<<((ostream *)&std::cout,
                    "  --version              -v          Show version infomation\n");
    std::operator<<((ostream *)&std::cout,
                    "  --wait-before-exit     -w          Wait before process exit\n");
    std::operator<<((ostream *)&std::cout,
                    "  --stack-resize <SIZE>  -S <SIZE>   Reset the size of runtime stack\n");
    std::operator<<((ostream *)&std::cout,
                    "  --log-path     <PATH>  -l <PATH>   Set the log and AST exporting path\n");
    pcVar8 = "  --import-path  <PATH>  -i <PATH>   Set the import path\n";
    poVar6 = (ostream *)&std::cout;
  }
  else {
    if (show_version_info != true) {
      if ((iVar5 == args_size) || (repl != false)) {
        if (silent == false) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "Covariant Script Programming Language Interpreter REPL\nVersion: "
                                  );
          poVar6 = std::operator<<(poVar6,(string *)(cs::current_process + 8));
          poVar6 = std::operator<<(poVar6," [");
          poVar6 = std::operator<<(poVar6,"GCC/Clang");
          poVar6 = std::operator<<(poVar6," on ");
          poVar6 = std::operator<<(poVar6,"Linux");
          poVar6 = std::operator<<(poVar6,
                                   "]\nCopyright (C) 2017-2025 Michael Lee. All rights reserved.\nPlease visit <http://covscript.org.cn/> for more information."
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        cs_impl::any::make_constant<std::__cxx11::string,char_const(&)[11]>
                  ((any *)&out,(char (*) [11])"<REPL_ENV>");
        __l._M_len = 1;
        __l._M_array = (iterator)&out;
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&path,__l,
                   (allocator_type *)&arg);
        cs_impl::any::recycle((any *)&out);
        lVar9 = (long)iVar5;
        ppcVar7 = args + lVar9;
        for (; lVar9 < args_size; lVar9 = lVar9 + 1) {
          cs_impl::any::make_constant<std::__cxx11::string,char*&>((any *)&out,ppcVar7);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&path,(any *)&out);
          cs_impl::any::recycle((any *)&out);
          ppcVar7 = ppcVar7 + 1;
        }
        cs::create_context((cs *)&__begin4,(array *)&path);
        std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_3b8,
                   (__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *)&__begin4);
        local_3b8._M_ptr = (element_type *)0x0;
        local_3b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8._M_refcount);
        activate_sigint_handler();
        local_358._M_unused._M_object = (void *)0x0;
        local_358._8_8_ = 0;
        local_340 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:290:53)>
                    ::_M_invoke;
        local_348 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:290:53)>
                    ::_M_manager;
        cs::stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
                  ((stack_type<std::function<bool(void*)>,std::allocator> *)
                   (cs::current_process + 0xa8),(function<bool_(void_*)> *)&local_358);
        std::_Function_base::~_Function_base((_Function_base *)&local_358);
        local_378._M_unused._M_object = (void *)0x0;
        local_378._8_8_ = 0;
        local_360 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:294:55)>
                    ::_M_invoke;
        local_368 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:294:55)>
                    ::_M_manager;
        cs::stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
                  ((stack_type<std::function<bool(void*)>,std::allocator> *)
                   (cs::current_process + 0xd0),(function<bool_(void_*)> *)&local_378);
        std::_Function_base::~_Function_base((_Function_base *)&local_378);
        local_398._M_unused._M_object = (void *)0x0;
        local_398._8_8_ = 0;
        local_380 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:297:55)>
                    ::_M_invoke;
        local_388 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:297:55)>
                    ::_M_manager;
        cs::stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
                  ((stack_type<std::function<bool(void*)>,std::allocator> *)
                   (cs::current_process + 0xd0),(function<bool_(void_*)> *)&local_398);
        std::_Function_base::~_Function_base((_Function_base *)&local_398);
        *(bool *)(*(long *)__begin4.ctrl_ + 0xa8) = no_optimize;
        std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_3c8,
                   (__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *)&__begin4);
        cs::repl::repl((repl *)&arg,(context_t *)&local_3c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c8._M_refcount);
        std::ofstream::ofstream(&out);
        context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_470;
        context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_470._M_local_buf[0] = '\0';
        do {
          if (((&std::exception::typeinfo)[*(long *)(std::cin + -0x18)] & 5) != 0) {
            _code = (element_type *)((ulong)_code & 0xffffffff00000000);
            cs::process_context::on_process_exit_default_handler((string *)&code);
          }
          if (silent == false) {
            _code = (element_type *)local_438;
            std::__cxx11::string::_M_construct
                      ((ulong)&code,(char)((long)local_c0 - (long)local_c8 >> 2));
            poVar6 = std::operator<<((ostream *)&std::cout,(string *)&code);
            std::operator<<(poVar6,"> ");
            std::ostream::flush();
            std::__cxx11::string::~string((string *)&code);
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)&context);
          cs::process_context::poll_event((process_context *)cs::current_process);
          cs::repl::exec((repl *)&arg,(string *)&context);
        } while( true );
      }
      lVar9 = (long)iVar5;
      std::__cxx11::string::string((string *)&out,args[lVar9],(allocator *)&arg);
      cs::process_path(&path,(string *)&out);
      std::__cxx11::string::~string((string *)&out);
      bVar4 = std::operator!=(&path,"STDIN");
      if (bVar4) {
        bVar4 = cs_impl::file_system::exist(&path);
        if (((!bVar4) || (bVar4 = cs_impl::file_system::is_dir(&path), bVar4)) ||
           (bVar4 = cs_impl::file_system::can_read(&path), !bVar4)) {
          this_00 = (fatal_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&out,"invalid input file.",(allocator *)&arg);
          cs::fatal_error::fatal_error(this_00,(string *)&out);
          __cxa_throw(this_00,&cs::fatal_error::typeinfo,cs::fatal_error::~fatal_error);
        }
        cs::prepend_import_path(&path,(process_context *)cs::current_process);
      }
      std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
                (&arg.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>);
      ppcVar7 = args + lVar9;
      for (; lVar9 < args_size; lVar9 = lVar9 + 1) {
        cs_impl::any::make_constant<std::__cxx11::string,char*&>((any *)&out,ppcVar7);
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                  (&arg,(any *)&out);
        cs_impl::any::recycle((any *)&out);
        ppcVar7 = ppcVar7 + 1;
      }
      cs::create_context((cs *)&context.
                                super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>,
                         &arg);
      std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3a8,
                 &context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
      _code = local_3a8._M_ptr;
      _Stack_440._M_pi = local_3a8._M_refcount._M_pi;
      local_3a8._M_ptr = (element_type *)0x0;
      local_3a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a8._M_refcount);
      local_338._8_8_ = 0;
      local_320 = std::
                  _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:223:53)>
                  ::_M_invoke;
      local_328 = std::
                  _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:223:53)>
                  ::_M_manager;
      local_338._M_unused._M_object =
           &context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>;
      cs::stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
                ((stack_type<std::function<bool(void*)>,std::allocator> *)
                 (cs::current_process + 0xa8),(function<bool_(void_*)> *)&local_338);
      std::_Function_base::~_Function_base((_Function_base *)&local_338);
      this = ((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this->disable_optimizer = no_optimize;
      if (csym_path_abi_cxx11_._M_string_length != 0) {
        cs::compiler_type::import_csym(this,&path,&csym_path_abi_cxx11_);
      }
      bVar4 = std::operator==(&path,"STDIN");
      if (bVar4) {
        std::__cxx11::string::assign
                  ((char *)&(context.
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->file_path);
        cs::instance_type::compile
                  (((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(istream *)&std::cin);
      }
      else {
        cs::instance_type::compile
                  (((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&path);
      }
      if (dump_ast == true) {
        if (log_path_abi_cxx11_._M_string_length == 0) {
          cs::instance_type::dump_ast
                    (((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->instance).
                     super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (ostream *)&std::cout);
        }
        else {
          std::ofstream::ofstream(&out,(string *)&log_path_abi_cxx11_,_S_out);
          cs::instance_type::dump_ast
                    (((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->instance).
                     super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (ostream *)&out);
          std::ofstream::~ofstream(&out);
        }
      }
      if (dump_dependency == true) {
        if (log_path_abi_cxx11_._M_string_length == 0) {
          peVar1 = ((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          _out = phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                 ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                          *)&peVar1->modules);
          pcVar2 = (peVar1->modules).
                   super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                   .
                   super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                   .ctrl_;
          sVar3 = (peVar1->modules).
                  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                  .
                  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                  .capacity_;
          while (_out != pcVar2 + sVar3) {
            poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_310.slot_);
            std::endl<char,std::char_traits<char>>(poVar6);
            phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
            ::iterator::operator++((iterator *)&out);
          }
        }
        else {
          std::ofstream::ofstream(&out,(string *)&log_path_abi_cxx11_,_S_out);
          peVar1 = ((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          __begin4 = phmap::priv::
                     raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                     ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                              *)&peVar1->modules);
          pcVar2 = (peVar1->modules).
                   super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                   .
                   super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                   .ctrl_;
          sVar3 = (peVar1->modules).
                  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                  .
                  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                  .capacity_;
          while (__begin4.ctrl_ != pcVar2 + sVar3) {
            poVar6 = std::operator<<((ostream *)&out,(string *)__begin4.field_1.slot_);
            std::endl<char,std::char_traits<char>>(poVar6);
            phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
            ::iterator::operator++(&__begin4);
          }
          std::ofstream::~ofstream(&out);
        }
      }
      if (compile_only == false) {
        cs::instance_type::interpret
                  (((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      cs::raii_collector::~raii_collector((raii_collector *)&code);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(&arg);
      std::__cxx11::string::~string((string *)&path);
      return;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"Version: ");
    poVar6 = std::operator<<(poVar6,(string *)(cs::current_process + 8));
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "Licensed under the Apache License, Version 2.0 (the \"License\");\nyou may not use this file except in compliance with the License.\nYou may obtain a copy of the License at\n\nhttp://www.apache.org/licenses/LICENSE-2.0\n\nUnless required by applicable law or agreed to in writing, software\ndistributed under the License is distributed on an \"AS IS\" BASIS,\nWITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\nSee the License for the specific language governing permissions and\nlimitations under the License.\n\nCopyright (C) 2017-2025 Michael Lee\n\nThis software is registered with the National Copyright Administration\nof the People\'s Republic of China(Registration Number: 2020SR0408026)\nand is protected by the Copyright Law of the People\'s Republic of China.\n\nPlease visit http://covscript.org.cn for more information."
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    std::operator<<((ostream *)&std::cout,"\nMetadata:\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"  Import Path: ");
    poVar6 = std::operator<<(poVar6,(string *)(cs::current_process + 0x58));
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"  STD Version: ");
    cs_impl::any::any<cs::numeric>((any *)&out,(numeric *)(cs::current_process + 0x30));
    poVar6 = operator<<(poVar6,(any *)&out);
    std::operator<<(poVar6,"\n");
    cs_impl::any::recycle((any *)&out);
    poVar6 = std::operator<<((ostream *)&std::cout,"  API Version: ");
    poVar6 = std::operator<<(poVar6,"230801");
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"  ABI Version: ");
    poVar6 = std::operator<<(poVar6,"230308");
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"  Runtime Env: ");
    poVar6 = std::operator<<(poVar6,"Linux");
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"  Compile Env: ");
    poVar6 = std::operator<<(poVar6,"GCC/Clang");
    pcVar8 = "\n";
  }
  std::operator<<(poVar6,pcVar8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void covscript_main(int args_size, char *args[])
{
	int index = covscript_args(args_size, args);
	cs::current_process->import_path += cs::path_delimiter + cs::get_import_path();
	if (show_help_info) {
		std::cout << "Usage:\n";
		std::cout << "    cs [options...] <FILE|STDIN> [arguments...]\n";
		std::cout << "    cs [options...]\n";
		std::cout << std::endl;
		std::cout << "Interpreter Options:" << std::endl;
		std::cout << "    Option                Mnemonic   Function\n";
		std::cout << "  --compile-only         -c          Only compile\n";
		std::cout << "  --dump-ast             -d          Export abstract syntax tree\n";
		std::cout << "  --dependency           -r          Export module dependency\n";
		std::cout << "  --csym         <FILE>  -g <FILE>   Read cSYM from file\n";
		std::cout << std::endl;
		std::cout << "Interpreter REPL Options:" << std::endl;
		std::cout << "    Option                Mnemonic   Function\n";
		std::cout << "  --silent               -s          Close the command prompt\n";
		std::cout << "  --args <...>           -a <...>    Set the arguments\n";
		std::cout << std::endl;
		std::cout << "Common Options:" << std::endl;
		std::cout << "    Option                Mnemonic   Function\n";
		std::cout << "  --no-optimize          -o          Disable optimizer\n";
		std::cout << "  --help                 -h          Show help infomation\n";
		std::cout << "  --version              -v          Show version infomation\n";
		std::cout << "  --wait-before-exit     -w          Wait before process exit\n";
		std::cout << "  --stack-resize <SIZE>  -S <SIZE>   Reset the size of runtime stack\n";
		std::cout << "  --log-path     <PATH>  -l <PATH>   Set the log and AST exporting path\n";
		std::cout << "  --import-path  <PATH>  -i <PATH>   Set the import path\n";
		std::cout << std::endl;
		return;
	}
	else if (show_version_info) {
		std::cout << "Version: " << cs::current_process->version << std::endl;
		std::cout << cs::copyright_info << std::endl;
		std::cout << "\nMetadata:\n";
		std::cout << "  Import Path: " << cs::current_process->import_path << "\n";
		std::cout << "  STD Version: " << cs::current_process->std_version << "\n";
		std::cout << "  API Version: " << CS_GET_VERSION_STR(COVSCRIPT_API_VERSION) << "\n";
		std::cout << "  ABI Version: " << CS_GET_VERSION_STR(COVSCRIPT_ABI_VERSION) << "\n";
		std::cout << "  Runtime Env: " << COVSCRIPT_PLATFORM_NAME << "\n";
		std::cout << "  Compile Env: " << COVSCRIPT_COMPILER_NAME << "\n";
		std::cout << std::endl;
		return;
	}
	if (!repl && index != args_size) {
		std::string path = cs::process_path(args[index]);
		if (path != "STDIN") {
			if (!cs_impl::file_system::exist(path) || cs_impl::file_system::is_dir(path) ||
			        !cs_impl::file_system::can_read(path))
				throw cs::fatal_error("invalid input file.");
			cs::prepend_import_path(path, cs::current_process);
		}
		cs::array arg;
		for (; index < args_size; ++index)
			arg.emplace_back(cs::var::make_constant<cs::string>(args[index]));
		cs::context_t context = cs::create_context(arg);
		cs::raii_collector context_gc(context);
		cs::current_process->on_process_exit.add_listener([&context](void *code) -> bool {
			cs::current_process->exit_code = *static_cast<int *>(code);
			throw cs::fatal_error("CS_EXIT");
			return true;
		});
		context->compiler->disable_optimizer = no_optimize;
		// Reads cSYM
		if (!csym_path.empty())
			context->compiler->import_csym(path, csym_path);
		try {
			if (path == "STDIN") {
				context->file_path = "STDIN";
				context->instance->compile(std::cin);
			}
			else
				context->instance->compile(path);
			if (dump_ast) {
				if (!log_path.empty()) {
					std::ofstream out(::log_path);
					context->instance->dump_ast(out);
				}
				else
					context->instance->dump_ast(std::cout);
			}
			if (dump_dependency) {
				if (!log_path.empty()) {
					std::ofstream out(::log_path);
					for (auto &it: context->compiler->modules)
						out << it.first << std::endl;
				}
				else {
					for (auto &it: context->compiler->modules)
						std::cout << it.first << std::endl;
				}
			}
			if (!compile_only)
				context->instance->interpret();
		}
		catch (const cs::exception &ce) {
			if (std::strstr(ce.what(), "CS_EXIT") == nullptr) {
				if (context->compiler->csyms.count(ce.file()) > 0) {
					cs::exception ne(ce);
					ne.relocate_to_csym(context->compiler->csyms[ce.file()]);
					throw ne;
				}
				else
					throw;
			}
		}
		catch (...) {
			throw;
		}
	}
	else {
		if (!silent)
			std::cout << "Covariant Script Programming Language Interpreter REPL\nVersion: "
			          << cs::current_process->version << " [" << COVSCRIPT_COMPILER_NAME << " on " << COVSCRIPT_PLATFORM_NAME << "]\n"
			          "Copyright (C) 2017-2025 Michael Lee. All rights reserved.\n"
			          "Please visit <http://covscript.org.cn/> for more information."
			          << std::endl;
		cs::array
		arg{cs::var::make_constant<cs::string>("<REPL_ENV>")};
		for (; index < args_size; ++index)
			arg.emplace_back(cs::var::make_constant<cs::string>(args[index]));
		cs::context_t context = cs::create_context(arg);
		cs::raii_collector context_gc(context);
		activate_sigint_handler();
		cs::current_process->on_process_exit.add_listener([](void *code) -> bool {
			cs::current_process->exit_code = *static_cast<int *>(code);
			throw cs::fatal_error("CS_EXIT");
		});
		cs::current_process->on_process_sigint.add_listener([](void *) -> bool {
			throw cs::fatal_error("CS_SIGINT");
		});
		cs::current_process->on_process_sigint.add_listener([](void *) -> bool {
			std::cin.clear();
			return false;
		});
		context->compiler->disable_optimizer = no_optimize;
		cs::repl repl(context);
		std::ofstream log_stream;
		std::string line;
		repl.echo = !silent;
		while (true) {
			try {
#ifdef COVSCRIPT_PLATFORM_WIN32
				if (!silent)
					std::cout << std::string(repl.get_level() * 2, '.') << "> " << std::flush;
				// Workaround: https://stackoverflow.com/a/26763490
				while (true) {
					cs::current_process->poll_event();
					std::getline(std::cin, line);
					if (std::cin)
						break;
				}
#else
				if (!std::cin) {
					int code = 0;
					cs::process_context::on_process_exit_default_handler(&code);
				}
				if (!silent)
					std::cout << std::string(repl.get_level() * 2, '.') << "> " << std::flush;
				std::getline(std::cin, line);
				cs::current_process->poll_event();
#endif
				repl.exec(line);
			}
			catch (const std::exception &e) {
				if (std::strstr(e.what(), "CS_SIGINT") != nullptr) {
					cs::process_context::cleanup_context();
					repl.reset_status();
					activate_sigint_handler();
				}
				else if (std::strstr(e.what(), "CS_EXIT") == nullptr) {
					if (!log_path.empty()) {
						if (!log_stream.is_open())
							log_stream.open(::log_path);
						if (log_stream)
							log_stream << e.what() << std::endl;
						else
							std::cerr << "Write log failed." << std::endl;
					}
					std::cerr << e.what() << std::endl;
				}
				else
					break;
			}
			catch (...) {
				throw;
			}
		}
	}
}